

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O2

void __thiscall ASDCP::MXF::GenericPackage::GenericPackage(GenericPackage *this,GenericPackage *rhs)

{
  UMID *pUVar1;
  
  InterchangeObject::InterchangeObject
            (&this->super_InterchangeObject,(rhs->super_InterchangeObject).m_Dict);
  (this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket =
       (_func_int **)&PTR__GenericPackage_00216fd8;
  (this->PackageUID).super_Identifier<32U>.m_HasValue = false;
  (this->PackageUID).super_Identifier<32U>.m_Value[0] = '\0';
  (this->PackageUID).super_Identifier<32U>.m_Value[1] = '\0';
  (this->PackageUID).super_Identifier<32U>.m_Value[2] = '\0';
  (this->PackageUID).super_Identifier<32U>.m_Value[3] = '\0';
  (this->PackageUID).super_Identifier<32U>.m_Value[4] = '\0';
  (this->PackageUID).super_Identifier<32U>.m_Value[5] = '\0';
  (this->PackageUID).super_Identifier<32U>.m_Value[6] = '\0';
  pUVar1 = &this->PackageUID;
  (pUVar1->super_Identifier<32U>).m_Value[7] = '\0';
  (pUVar1->super_Identifier<32U>).m_Value[8] = '\0';
  (pUVar1->super_Identifier<32U>).m_Value[9] = '\0';
  (pUVar1->super_Identifier<32U>).m_Value[10] = '\0';
  (pUVar1->super_Identifier<32U>).m_Value[0xb] = '\0';
  (pUVar1->super_Identifier<32U>).m_Value[0xc] = '\0';
  (pUVar1->super_Identifier<32U>).m_Value[0xd] = '\0';
  (pUVar1->super_Identifier<32U>).m_Value[0xe] = '\0';
  pUVar1 = &this->PackageUID;
  (pUVar1->super_Identifier<32U>).m_Value[0xf] = '\0';
  (pUVar1->super_Identifier<32U>).m_Value[0x10] = '\0';
  (pUVar1->super_Identifier<32U>).m_Value[0x11] = '\0';
  (pUVar1->super_Identifier<32U>).m_Value[0x12] = '\0';
  (pUVar1->super_Identifier<32U>).m_Value[0x13] = '\0';
  (pUVar1->super_Identifier<32U>).m_Value[0x14] = '\0';
  (pUVar1->super_Identifier<32U>).m_Value[0x15] = '\0';
  (pUVar1->super_Identifier<32U>).m_Value[0x16] = '\0';
  pUVar1 = &this->PackageUID;
  (pUVar1->super_Identifier<32U>).m_Value[0x17] = '\0';
  (pUVar1->super_Identifier<32U>).m_Value[0x18] = '\0';
  (pUVar1->super_Identifier<32U>).m_Value[0x19] = '\0';
  (pUVar1->super_Identifier<32U>).m_Value[0x1a] = '\0';
  (pUVar1->super_Identifier<32U>).m_Value[0x1b] = '\0';
  (pUVar1->super_Identifier<32U>).m_Value[0x1c] = '\0';
  (pUVar1->super_Identifier<32U>).m_Value[0x1d] = '\0';
  (pUVar1->super_Identifier<32U>).m_Value[0x1e] = '\0';
  (this->PackageUID).super_Identifier<32U>.m_Value[0x1f] = '\0';
  (this->PackageUID).super_Identifier<32U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_00219748;
  (this->Name).m_property.super_string._M_dataplus._M_p =
       (pointer)&(this->Name).m_property.super_string.field_2;
  (this->Name).m_property.super_string._M_string_length = 0;
  (this->Name).m_property.super_string.field_2._M_local_buf[0] = '\0';
  (this->Name).m_property.super_IArchive._vptr_IArchive = (_func_int **)&PTR__UTF16String_00215c60;
  (this->Name).m_has_value = false;
  Kumu::Timestamp::Timestamp(&this->PackageCreationDate);
  Kumu::Timestamp::Timestamp(&this->PackageModifiedDate);
  (this->Tracks).
  super_FixedSizeItemCollection<std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>.
  super_vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>.
  super__Vector_base<Kumu::UUID,_std::allocator<Kumu::UUID>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->Tracks).
  super_FixedSizeItemCollection<std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>.
  super_vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>.
  super__Vector_base<Kumu::UUID,_std::allocator<Kumu::UUID>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->Tracks).
  super_FixedSizeItemCollection<std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>.
  super_vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>.
  super__Vector_base<Kumu::UUID,_std::allocator<Kumu::UUID>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->Tracks).
  super_FixedSizeItemCollection<std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>.
  super_IArchive._vptr_IArchive = (_func_int **)&PTR__FixedSizeItemCollection_00216a00;
  (*(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket[0x12])(this,rhs);
  return;
}

Assistant:

GenericPackage::GenericPackage(const GenericPackage& rhs) : InterchangeObject(rhs.m_Dict)
{
  Copy(rhs);
}